

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O2

void __thiscall RX::RX(RX *this,RX *other)

{
  this->_compiled = false;
  std::__cxx11::string::string((string *)&this->_pattern,(string *)&other->_pattern);
  this->_case_sensitive = other->_case_sensitive;
  return;
}

Assistant:

RX::RX (const RX& other)
: _compiled (false)
, _pattern (other._pattern)
, _case_sensitive (other._case_sensitive)
{
}